

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

DynamicStackArray<float,_16UL,_64UL> * __thiscall
embree::DynamicStackArray<float,_16UL,_64UL>::operator=
          (DynamicStackArray<float,_16UL,_64UL> *this,DynamicStackArray<float,_16UL,_64UL> *other)

{
  float fVar1;
  size_t i_1;
  DynamicStackArray<float,_16UL,_64UL> *pDVar2;
  float *pfVar3;
  long lVar4;
  ulong uVar5;
  size_t i;
  ulong uVar6;
  
  uVar6 = 0;
  while( true ) {
    uVar5 = 0x40;
    if ((DynamicStackArray<float,_16UL,_64UL> *)other->data == other) {
      uVar5 = 0x10;
    }
    if (uVar5 <= uVar6) break;
    fVar1 = ((DynamicStackArray<float,_16UL,_64UL> *)other->data)->arr[uVar6];
    pDVar2 = (DynamicStackArray<float,_16UL,_64UL> *)this->data;
    if ((0xf < uVar6) && (pDVar2 == this)) {
      pfVar3 = (float *)operator_new__(0x100);
      this->data = pfVar3;
      for (lVar4 = 0; lVar4 != 0x10; lVar4 = lVar4 + 1) {
        this->data[lVar4] = this->arr[lVar4];
      }
      pDVar2 = (DynamicStackArray<float,_16UL,_64UL> *)this->data;
    }
    pDVar2->arr[uVar6] = fVar1;
    uVar6 = uVar6 + 1;
  }
  return this;
}

Assistant:

DynamicStackArray& operator= (const DynamicStackArray& other)
    {
      for (size_t i=0; i<other.size(); i++)
        this->operator[] (i) = other[i];

      return *this;
    }